

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

R QHashPrivate::Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_>::allocateSpans
            (size_t numBuckets)

{
  undefined1 auVar1 [16];
  R RVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  Span *pSVar6;
  ulong in_RDI;
  ulong uVar7;
  size_t nSpans;
  size_t MaxBucketCount;
  qptrdiff MaxSpanCount;
  Span *local_50;
  
  if (0x71c71c71c71c7180 < in_RDI) {
    qt_noop();
  }
  uVar3 = in_RDI >> 7;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(0x90),0);
  uVar7 = uVar4 + 8;
  if (SUB168(auVar1 * ZEXT816(0x90),8) != 0 || 0xfffffffffffffff7 < uVar4) {
    uVar7 = 0xffffffffffffffff;
  }
  puVar5 = (ulong *)operator_new__(uVar7);
  *puVar5 = uVar3;
  pSVar6 = (Span *)(puVar5 + 1);
  if (uVar3 != 0) {
    local_50 = pSVar6;
    do {
      Span<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_>::Span
                ((Span<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *)0x468237);
      local_50 = local_50 + 1;
    } while (local_50 != pSVar6 + uVar3);
  }
  RVar2.nSpans = uVar3;
  RVar2.spans = pSVar6;
  return RVar2;
}

Assistant:

static auto allocateSpans(size_t numBuckets)
    {
        struct R {
            Span *spans;
            size_t nSpans;
        };

        constexpr qptrdiff MaxSpanCount = (std::numeric_limits<qptrdiff>::max)() / sizeof(Span);
        constexpr size_t MaxBucketCount = MaxSpanCount << SpanConstants::SpanShift;

        if (numBuckets > MaxBucketCount) {
            Q_CHECK_PTR(false);
            Q_UNREACHABLE();    // no exceptions and no assertions -> no error reporting
        }

        size_t nSpans = numBuckets >> SpanConstants::SpanShift;
        return R{ new Span[nSpans], nSpans };
    }